

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int av1_get_max_num_workers(AV1_COMP *cpi)

{
  int local_18;
  int local_14;
  int i;
  int max_num_workers;
  AV1_COMP *cpi_local;
  
  max_num_workers = 0;
  for (i = 0; i < 0xc; i = i + 1) {
    if (max_num_workers < (cpi->ppi->p_mt_info).num_mod_workers[i]) {
      local_14 = (cpi->ppi->p_mt_info).num_mod_workers[i];
    }
    else {
      local_14 = max_num_workers;
    }
    max_num_workers = local_14;
  }
  if (max_num_workers < (cpi->oxcf).max_threads) {
    local_18 = max_num_workers;
  }
  else {
    local_18 = (cpi->oxcf).max_threads;
  }
  return local_18;
}

Assistant:

int av1_get_max_num_workers(const AV1_COMP *cpi) {
  int max_num_workers = 0;
  for (int i = MOD_FP; i < NUM_MT_MODULES; i++)
    max_num_workers =
        AOMMAX(cpi->ppi->p_mt_info.num_mod_workers[i], max_num_workers);
  assert(max_num_workers >= 1);
  return AOMMIN(max_num_workers, cpi->oxcf.max_threads);
}